

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void set_close_on_exec(int fd,mg_connection *conn,mg_context *ctx)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  mg_connection *local_a10;
  undefined1 local_a08 [8];
  mg_connection fc;
  mg_context *ctx_local;
  mg_connection *conn_local;
  int fd_local;
  
  fc.tls_user_ptr = ctx;
  iVar1 = fcntl64(fd,2,1);
  if ((iVar1 != 0) && ((conn != (mg_connection *)0x0 || (fc.tls_user_ptr != (void *)0x0)))) {
    local_a10 = conn;
    if (conn == (mg_connection *)0x0) {
      local_a10 = fake_connection((mg_connection *)local_a08,(mg_context *)fc.tls_user_ptr);
    }
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    mg_cry_internal_wrap
              (local_a10,(mg_context *)0x0,"set_close_on_exec",0x163c,
               "%s: fcntl(F_SETFD FD_CLOEXEC) failed: %s","set_close_on_exec",pcVar3);
  }
  return;
}

Assistant:

static void
set_close_on_exec(int fd,
                  const struct mg_connection *conn /* may be null */,
                  struct mg_context *ctx /* may be null */)
{
#if defined(__ZEPHYR__)
	(void)fd;
	(void)conn;
	(void)ctx;
#else
	if (fcntl(fd, F_SETFD, FD_CLOEXEC) != 0) {
		if (conn || ctx) {
			struct mg_connection fc;
			mg_cry_internal((conn ? conn : fake_connection(&fc, ctx)),
			                "%s: fcntl(F_SETFD FD_CLOEXEC) failed: %s",
			                __func__,
			                strerror(ERRNO));
		}
	}
#endif
}